

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_schnorrsig_sha256_tagged(secp256k1_sha256 *sha)

{
  secp256k1_sha256 *sha_local;
  
  secp256k1_sha256_initialize(sha);
  sha->s[0] = 0x9cecba11;
  sha->s[1] = 0x23925381;
  sha->s[2] = 0x11679112;
  sha->s[3] = 0xd1627e0f;
  sha->s[4] = 0x97c87550;
  sha->s[5] = 0x3cc765;
  sha->s[6] = 0x90f61164;
  sha->s[7] = 0x33e9b66a;
  sha->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_schnorrsig_sha256_tagged(secp256k1_sha256 *sha) {
    secp256k1_sha256_initialize(sha);
    sha->s[0] = 0x9cecba11ul;
    sha->s[1] = 0x23925381ul;
    sha->s[2] = 0x11679112ul;
    sha->s[3] = 0xd1627e0ful;
    sha->s[4] = 0x97c87550ul;
    sha->s[5] = 0x003cc765ul;
    sha->s[6] = 0x90f61164ul;
    sha->s[7] = 0x33e9b66aul;
    sha->bytes = 64;
}